

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,TrackJamTargetIdentifier *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Site:        ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID)
  ;
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Application: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_EntityIdentifier).super_SimulationIdentifier.
                             m_ui16ApplicationID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Entity:      ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(ushort *)
                              &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xc);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Emitter ID:  ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(byte)(this->super_EntityIdentifier).super_SimulationIdentifier
                                           .field_0xe);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Beam ID:     ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(byte)(this->super_EntityIdentifier).super_SimulationIdentifier
                                           .field_0xf);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString TrackJamTargetIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "Site:        " << m_ui16SiteID              << "\n"
       << "Application: " << m_ui16ApplicationID       << "\n"
       << "Entity:      " << m_ui16EntityID            << "\n"
       << "Emitter ID:  " << ( KUINT16 )m_ui8EmitterID << "\n"
       << "Beam ID:     " << ( KUINT16 )m_ui8BeamID    << "\n";

    return ss.str();
}